

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O2

bool __thiscall tinyusdz::StreamReader::read4(StreamReader *this,uint32_t *ret)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar2 = this->length_;
  uVar1 = this->idx_ + 4;
  if (uVar1 <= uVar2) {
    uVar4 = *(uint *)(this->binary_ + this->idx_);
    uVar5 = uVar4 >> 8;
    uVar6 = uVar4 >> 0x10;
    uVar3 = uVar4 >> 0x18;
    uVar7 = uVar5;
    if (this->swap_endian_ == true) {
      uVar8 = uVar4 & 0xff;
      uVar7 = uVar6;
      uVar4 = uVar3;
      uVar3 = uVar8;
      uVar6 = uVar5;
    }
    *ret = uVar4 & 0xff | (uVar7 & 0xff) << 8 | (uVar6 & 0xff) << 0x10 | uVar3 << 0x18;
    this->idx_ = uVar1;
  }
  return uVar1 <= uVar2;
}

Assistant:

bool read4(uint32_t *ret) const {
    if ((idx_ + 4) > length_) {
      return false;
    }

    uint32_t val;
    memcpy(&val, &binary_[idx_], sizeof(val));

    if (swap_endian_) {
      swap4(&val);
    }

    (*ret) = val;
    idx_ += 4;

    return true;
  }